

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesStandbySetMode(zes_standby_handle_t hStandby,zes_standby_promo_mode_t mode)

{
  zes_pfnStandbySetMode_t pfnSetMode;
  ze_result_t result;
  zes_standby_promo_mode_t mode_local;
  zes_standby_handle_t hStandby_local;
  
  pfnSetMode._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ccc0 != (code *)0x0) {
    pfnSetMode._0_4_ = (*DAT_0011ccc0)(hStandby,mode);
  }
  return (ze_result_t)pfnSetMode;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesStandbySetMode(
        zes_standby_handle_t hStandby,                  ///< [in] Handle for the component.
        zes_standby_promo_mode_t mode                   ///< [in] New standby mode.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetMode = context.zesDdiTable.Standby.pfnSetMode;
        if( nullptr != pfnSetMode )
        {
            result = pfnSetMode( hStandby, mode );
        }
        else
        {
            // generic implementation
        }

        return result;
    }